

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcLoadModuleBySource(char *module,char *code)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  nullres nVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  char *bytecode;
  TraceScope traceScope;
  char moduleRoot [1024];
  char path [1024];
  char *local_840;
  TraceScope local_838;
  char local_828 [1024];
  char local_428 [1024];
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcLoadModuleBySource::token == '\0') &&
     (iVar5 = __cxa_guard_acquire(&nullcLoadModuleBySource::token), iVar5 != 0)) {
    nullcLoadModuleBySource::token = NULLC::TraceGetToken("nullc","nullcLoadModuleBySource");
    __cxa_guard_release(&nullcLoadModuleBySource::token);
  }
  NULLC::TraceScope::TraceScope(&local_838,nullcLoadModuleBySource::token);
  lVar3 = NULLC::traceContext;
  sVar6 = strlen(module);
  uVar10 = (int)sVar6 + 1;
  if ((*(uint *)(lVar3 + 0x264) <= *(int *)(lVar3 + 0x260) + uVar10) ||
     (*(int *)(lVar3 + 0x270) == *(int *)(lVar3 + 0x274))) {
    NULLC::TraceDump();
  }
  if (*(uint *)(lVar3 + 0x264) <= uVar10) {
    __assert_fail("count < context.labels.max",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                  ,0x127,"void NULLC::TraceLabel(const char *)");
  }
  uVar1 = *(uint *)(lVar3 + 0x260);
  memcpy((void *)((ulong)uVar1 + *(long *)(lVar3 + 0x268)),module,(ulong)uVar10);
  *(int *)(lVar3 + 0x260) = *(int *)(lVar3 + 0x260) + uVar10;
  lVar2 = *(long *)(lVar3 + 0x278);
  uVar10 = *(uint *)(lVar3 + 0x270);
  *(uint *)(lVar3 + 0x270) = uVar10 + 1;
  *(uint *)(lVar2 + (ulong)uVar10 * 8) = uVar1 * 4 + 2;
  *(undefined4 *)(lVar2 + 4 + (ulong)uVar10 * 8) = 0;
  local_828[0] = '\0';
  pcVar7 = strrchr(module,0x2e);
  if (pcVar7 != (char *)0x0) {
    NULLC::SafeSprintf(local_828,0x400,"%.*s",(ulong)(uint)((int)pcVar7 - (int)module),module);
    sVar6 = strlen(local_828);
    if ((int)sVar6 != 0) {
      uVar8 = 0;
      do {
        cVar9 = local_828[uVar8];
        if (cVar9 == '.') {
          cVar9 = '/';
        }
        local_828[uVar8] = cVar9;
        uVar8 = uVar8 + 1;
      } while ((sVar6 & 0xffffffff) != uVar8);
    }
  }
  pcVar7 = (char *)0x0;
  if (local_828[0] != '\0') {
    pcVar7 = local_828;
  }
  nVar4 = nullcCompileWithModuleRoot(code,pcVar7);
  if (nVar4 != '\0') {
    sVar6 = strlen(module);
    if (sVar6 < 0x201) {
      strcpy(local_428,module);
      if (local_428[0] != '\0') {
        pcVar7 = local_428;
        do {
          pcVar7 = pcVar7 + 1;
          if (local_428[0] == '.') {
            pcVar7[-1] = '/';
          }
          local_428[0] = *pcVar7;
        } while (local_428[0] != '\0');
      }
      sVar6 = strlen(local_428);
      builtin_strncpy(local_428 + sVar6,".nc",4);
      pcVar7 = BinaryCache::GetBytecode(local_428);
      if (pcVar7 == (char *)0x0) {
        local_840 = (char *)0x0;
        nullcGetBytecode(&local_840);
        nullcClean();
        BinaryCache::PutBytecode(local_428,local_840,(Lexeme *)0x0,0);
        nVar4 = '\x01';
        goto LAB_0010afb4;
      }
      NULLC::nullcLastError = "ERROR: module already loaded";
    }
    else {
      NULLC::nullcLastError = "ERROR: module name is too long";
    }
  }
  nVar4 = '\0';
LAB_0010afb4:
  NULLC::TraceScope::~TraceScope(&local_838);
  return nVar4;
}

Assistant:

nullres nullcLoadModuleBySource(const char* module, const char* code)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLoadModuleBySource");
	TRACE_LABEL(module);

	const unsigned moduleRootLength = 1024;
	char moduleRoot[moduleRootLength];
	*moduleRoot = 0;

	if(const char *pos = strrchr(module, '.'))
	{
		NULLC::SafeSprintf(moduleRoot, moduleRootLength, "%.*s", unsigned(pos - module), module);

		for(unsigned i = 0, e = unsigned(strlen(moduleRoot)); i < e; i++)
			moduleRoot[i] = moduleRoot[i] == '.' ? '/' : moduleRoot[i];
	}

	if(!nullcCompileWithModuleRoot(code, *moduleRoot ? moduleRoot : NULL))
		return false;

	if(strlen(module) > 512)
	{
		nullcLastError = "ERROR: module name is too long";
		return false;
	}

	char	path[1024];
	strcpy(path, module);
	char	*pos = path;
	while(*pos)
		if(*pos++ == '.')
			pos[-1] = '/';
	strcat(path, ".nc");

	if(BinaryCache::GetBytecode(path))
	{
		nullcLastError = "ERROR: module already loaded";
		return false;
	}

	char *bytecode = NULL;
	nullcGetBytecode(&bytecode);
	nullcClean();

	BinaryCache::PutBytecode(path, bytecode, NULL, 0);
	return 1;
}